

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImGuiTabBar *__src;
  ImGuiTabBar *__dest;
  int iVar4;
  
  iVar2 = this->FreeIdx;
  iVar4 = (this->Buf).Size;
  if (iVar2 == iVar4) {
    iVar1 = iVar4 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar4) {
      if (iVar3 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar3 / 2 + iVar3;
      }
      if (iVar4 <= iVar1) {
        iVar4 = iVar1;
      }
      if (iVar3 < iVar4) {
        __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar4 * 0x98);
        __src = (this->Buf).Data;
        if (__src != (ImGuiTabBar *)0x0) {
          memcpy(__dest,__src,(long)(this->Buf).Size * 0x98);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar4;
      }
    }
    (this->Buf).Size = iVar1;
    iVar4 = this->FreeIdx + 1;
  }
  else {
    iVar4 = (this->Buf).Data[iVar2].Tabs.Size;
  }
  this->FreeIdx = iVar4;
  ImGuiTabBar::ImGuiTabBar((this->Buf).Data + iVar2);
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }